

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::TcParseFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,TcParseFunction func)

{
  string_view pc;
  int v1;
  int v2;
  char *pcVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  AlphaNum *b;
  AlphaNum local_e8;
  size_t local_b8;
  char *local_b0;
  AlphaNum local_a8;
  LogMessage local_78;
  Voidify local_61;
  long local_60;
  int local_54;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int func_index;
  TcParseFunction func_local;
  
  absl_log_internal_check_op_result._7_1_ = (byte)this;
  absl_log_internal_check_op_result._0_4_ = (uint)absl_log_internal_check_op_result._7_1_;
  _func_index = __return_storage_ptr__;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                 ((uint)absl_log_internal_check_op_result);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"func_index >= 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
               ,0x10d,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  local_54 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((uint)absl_log_internal_check_op_result);
  pbVar3 = std::end<std::basic_string_view<char,std::char_traits<char>>const,124ul>
                     (&TcParseFunctionName::kNames);
  pbVar4 = std::begin<std::basic_string_view<char,std::char_traits<char>>const,124ul>
                     (&TcParseFunctionName::kNames);
  local_60 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((long)pbVar3 - (long)pbVar4 >> 4);
  local_50 = absl::lts_20250127::log_internal::Check_LTImpl<int,long>
                       (&local_54,&local_60,"func_index < std::end(kNames) - std::begin(kNames)");
  if (local_50 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
               ,0x10e,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_b8 = 0x12;
  local_b0 = "::_pbi::TcParser::";
  pc._M_str = "::_pbi::TcParser::";
  pc._M_len = 0x12;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,pc);
  b = (AlphaNum *)TcParseFunctionName::kNames[(int)(uint)absl_log_internal_check_op_result]._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_e8,TcParseFunctionName::kNames[(int)(uint)absl_log_internal_check_op_result]);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_a8,&local_e8,b);
  return __return_storage_ptr__;
}

Assistant:

static std::string TcParseFunctionName(internal::TcParseFunction func) {
#define PROTOBUF_TC_PARSE_FUNCTION_X(value) #value,
  static constexpr absl::string_view kNames[] = {
      {}, PROTOBUF_TC_PARSE_FUNCTION_LIST};
#undef PROTOBUF_TC_PARSE_FUNCTION_X
  const int func_index = static_cast<int>(func);
  ABSL_CHECK_GE(func_index, 0);
  ABSL_CHECK_LT(func_index, std::end(kNames) - std::begin(kNames));
  static constexpr absl::string_view ns = "::_pbi::TcParser::";
  return absl::StrCat(ns, kNames[func_index]);
}